

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O3

opj_bool opj_read_header(opj_stream_t *p_cio,opj_codec_t *p_codec,opj_image_t **p_image)

{
  opj_bool oVar1;
  
  if ((p_cio == (opj_stream_t *)0x0) || (p_codec == (opj_codec_t *)0x0)) {
    opj_read_header_cold_1();
  }
  else {
    if (*(int *)(p_codec + 0xc) != 0) {
      oVar1 = (*(code *)*p_codec)(p_cio,p_codec[10],p_image,p_codec[0xb],*p_codec);
      return oVar1;
    }
    opj_event_msg_v2((opj_event_mgr_t *)p_codec[0xb],1,
                     "Codec provided to the read_header function is not a decompressor handler.\n");
  }
  return 0;
}

Assistant:

opj_bool OPJ_CALLCONV opj_read_header (	opj_stream_t *p_cio,
										opj_codec_t *p_codec,
										opj_image_t **p_image )
{
	if (p_codec && p_cio) {
		opj_codec_private_t* l_info = (opj_codec_private_t*) p_codec;
		opj_stream_private_t* l_cio = (opj_stream_private_t*) p_cio;

		if(! l_info->is_decompressor) {
			opj_event_msg_v2(l_info->m_event_mgr, EVT_ERROR, "Codec provided to the read_header function is not a decompressor handler.\n");
			return OPJ_FALSE;
		}

		return l_info->m_codec_data.m_decompression.opj_read_header(
					l_cio,
					l_info->m_codec,
					p_image,
					l_info->m_event_mgr);
	}

	fprintf(stderr, "[ERROR] Input parameters of the read_header function are incorrect.\n");
	return OPJ_FALSE;
}